

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::vector
          (vector<immutable::vector<char,_false,_6>,_true,_5> *this)

{
  rrb<immutable::vector<char,_false,_6>,_true,_5> *prVar1;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_> local_38;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_> local_30;
  
  prVar1 = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)malloc(0x28);
  prVar1->cnt = 0;
  prVar1->shift = 0;
  prVar1->tail_len = 0;
  (prVar1->tail).ptr = (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0;
  (prVar1->root).ptr = (tree_node<immutable::vector<char,_false,_6>,_true> *)0x0;
  local_38.ptr = (leaf_node<immutable::vector<char,_false,_6>,_true> *)malloc(0x18);
  (local_38.ptr)->type = LEAF_NODE;
  (local_38.ptr)->len = 0;
  (local_38.ptr)->child = (vector<char,_false,_6> *)0x0;
  (local_38.ptr)->guid = 0;
  LOCK();
  ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  LOCK();
  ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
       ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  (prVar1->tail).ptr = local_38.ptr;
  local_30.ptr = (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>::~ref(&local_30);
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>::~ref(&local_38);
  (this->_impl).ptr = prVar1;
  LOCK();
  (prVar1->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

vector() = default;